

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall Edge::AllInputsReady(Edge *this)

{
  bool bVar1;
  reference ppNVar2;
  Edge *pEVar3;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_28;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_20;
  const_iterator i;
  Edge *this_local;
  
  i._M_current = (Node **)this;
  local_20._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->inputs_)
  ;
  do {
    local_28._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->inputs_)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return true;
    }
    ppNVar2 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_20);
    pEVar3 = Node::in_edge(*ppNVar2);
    if (pEVar3 != (Edge *)0x0) {
      ppNVar2 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_20);
      pEVar3 = Node::in_edge(*ppNVar2);
      bVar1 = outputs_ready(pEVar3);
      if (!bVar1) {
        return false;
      }
    }
    __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
    operator++(&local_20);
  } while( true );
}

Assistant:

bool Edge::AllInputsReady() const {
  for (vector<Node*>::const_iterator i = inputs_.begin();
       i != inputs_.end(); ++i) {
    if ((*i)->in_edge() && !(*i)->in_edge()->outputs_ready())
      return false;
  }
  return true;
}